

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O1

size_t duckdb_zstd::HUF_decompress1X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  ushort uVar1;
  char cVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  undefined1 *puVar8;
  ulong *puVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  bool bVar15;
  ulong *puStack_38;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar4 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar4;
  }
  if ((flags & 1U) != 0) {
    if (cSrcSize == 0) {
      cSrcSize = 0xffffffffffffffb8;
      uVar12 = 0;
      uVar5 = 0;
      puVar9 = (ulong *)0x0;
      cSrc = (ulong *)0x0;
      puVar14 = (ulong *)0x0;
    }
    else {
      puVar14 = (ulong *)((long)cSrc + 8);
      if (cSrcSize < 8) {
        uVar5 = (ulong)*cSrc;
        switch(cSrcSize) {
        case 7:
          uVar5 = uVar5 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
        case 6:
          uVar5 = uVar5 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
        case 5:
          uVar5 = uVar5 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
        case 4:
          uVar5 = uVar5 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
        case 3:
          uVar5 = uVar5 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
        case 2:
          uVar5 = uVar5 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
        default:
          bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
          uVar3 = (uint)bVar6;
          if (bVar6 == 0) {
            cSrcSize = 0xffffffffffffffec;
          }
          else {
            uVar3 = (LZCOUNT((uint)bVar6) ^ 0xffffffe0U) + (int)cSrcSize * -8 + 0x49;
          }
          uVar12 = (ulong)uVar3;
          puVar9 = (ulong *)cSrc;
        }
      }
      else {
        puVar9 = (ulong *)((long)cSrc + (cSrcSize - 8));
        uVar5 = *puVar9;
        bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar3 = (LZCOUNT((uint)bVar6) ^ 0xffffffe0U) + 9;
        if (bVar6 == 0) {
          uVar3 = (uint)bVar6;
        }
        uVar12 = (ulong)uVar3;
        cSrcSize = cSrcSize | -(ulong)(bVar6 == 0);
      }
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    puVar8 = (undefined1 *)((~((long)maxDstSize >> 0x3f) & maxDstSize) + (long)dst);
    uVar1 = *(ushort *)((long)DTable + 2);
    if (3 < (long)maxDstSize) {
      uVar3 = -(uint)uVar1 & 0x3f;
      do {
        uVar11 = (uint)uVar12;
        if (uVar11 < 0x41) {
          if (puVar9 < puVar14) {
            if (puVar9 == (ulong *)cSrc) {
              bVar15 = false;
              goto LAB_019450ed;
            }
            bVar15 = cSrc <= (ulong *)((long)puVar9 - (uVar12 >> 3));
            uVar7 = (int)puVar9 - (int)cSrc;
            if (bVar15) {
              uVar7 = (uint)(uVar12 >> 3);
            }
            uVar11 = uVar11 + uVar7 * -8;
          }
          else {
            uVar7 = (uint)(uVar12 >> 3);
            uVar11 = uVar11 & 7;
            bVar15 = true;
          }
          uVar12 = (ulong)uVar11;
          uVar5 = *(ulong *)((long)puVar9 - (ulong)uVar7);
          puVar9 = (ulong *)((long)puVar9 - (ulong)uVar7);
        }
        else {
          bVar15 = false;
          puVar9 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
        }
LAB_019450ed:
        if ((puVar8 + -3 <= dst) || (!bVar15)) goto LAB_019451d4;
        uVar13 = (uVar5 << (uVar12 & 0x3f)) >> uVar3;
        uVar11 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + (int)uVar12;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        uVar12 = (uVar5 << ((ulong)uVar11 & 0x3f)) >> uVar3;
        uVar11 = *(byte *)((long)DTable + uVar12 * 2 + 4) + uVar11;
        *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
        uVar12 = (uVar5 << ((ulong)uVar11 & 0x3f)) >> uVar3;
        uVar11 = *(byte *)((long)DTable + uVar12 * 2 + 4) + uVar11;
        *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
        uVar13 = (uVar5 << ((ulong)uVar11 & 0x3f)) >> uVar3;
        uVar12 = (ulong)(*(byte *)((long)DTable + uVar13 * 2 + 4) + uVar11);
        *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        dst = (void *)((long)dst + 4);
      } while( true );
    }
    uVar3 = (uint)uVar12;
    if (uVar3 < 0x41) {
      if (puVar9 < puVar14) {
        if (puVar9 == (ulong *)cSrc) goto LAB_019451d4;
        uVar11 = (int)puVar9 - (int)cSrc;
        if (cSrc <= (ulong *)((long)puVar9 - (uVar12 >> 3))) {
          uVar11 = (uint)(uVar12 >> 3);
        }
        uVar3 = uVar3 + uVar11 * -8;
      }
      else {
        uVar11 = (uint)(uVar12 >> 3);
        uVar3 = uVar3 & 7;
      }
      uVar12 = (ulong)uVar3;
      puVar9 = (ulong *)((long)puVar9 - (ulong)uVar11);
      uVar5 = *puVar9;
    }
    else {
      puVar9 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
    }
LAB_019451d4:
    if (dst < puVar8) {
      do {
        uVar13 = (uVar5 << (uVar12 & 0x3f)) >> (-(uint)uVar1 & 0x3f);
        uVar3 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + (int)uVar12;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        dst = (void *)((long)dst + 1);
        uVar12 = (ulong)uVar3;
      } while (dst < puVar8);
    }
    else {
      uVar3 = (uint)uVar12;
    }
    if (uVar3 != 0x40) {
      maxDstSize = 0xffffffffffffffec;
    }
    if (puVar9 != (ulong *)cSrc) {
      maxDstSize = 0xffffffffffffffec;
    }
    return maxDstSize;
  }
  uVar5 = 0;
  sVar4 = 0;
  if (0 < (long)maxDstSize) {
    sVar4 = maxDstSize;
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
    uVar12 = 0;
    puVar14 = (ulong *)0x0;
    cSrc = (ulong *)0x0;
    puStack_38 = (ulong *)0x0;
  }
  else {
    puStack_38 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar12 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar12 = uVar12 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar12 = uVar12 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar12 = uVar12 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar3 = 0x1f;
        if (bVar6 != 0) {
          for (; bVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        if (bVar6 == 0) {
          cSrcSize = 0xffffffffffffffec;
          uVar3 = 0;
        }
        else {
          uVar3 = ~uVar3 + (int)cSrcSize * -8 + 0x49;
        }
        uVar5 = (ulong)uVar3;
        puVar14 = (ulong *)cSrc;
      }
    }
    else {
      puVar14 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar12 = *puVar14;
      bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar3 = 0x1f;
      if (bVar6 != 0) {
        for (; bVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = ~uVar3 + 9;
      if (bVar6 == 0) {
        uVar3 = 0;
      }
      uVar5 = (ulong)uVar3;
      cSrcSize = cSrcSize | -(ulong)(bVar6 == 0);
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  puVar8 = (undefined1 *)(sVar4 + (long)dst);
  cVar2 = (char)*(undefined2 *)((long)DTable + 2);
  if (3 < (long)maxDstSize) {
    bVar6 = -cVar2 & 0x3f;
    do {
      uVar3 = (uint)uVar5;
      if (uVar3 < 0x41) {
        if (puVar14 < puStack_38) {
          if (puVar14 == (ulong *)cSrc) {
            bVar15 = false;
            goto LAB_019410a9;
          }
          bVar15 = cSrc <= (ulong *)((long)puVar14 - (uVar5 >> 3));
          uVar11 = (int)puVar14 - (int)cSrc;
          if (bVar15) {
            uVar11 = (uint)(uVar5 >> 3);
          }
          uVar3 = uVar3 + uVar11 * -8;
        }
        else {
          uVar11 = (uint)(uVar5 >> 3);
          uVar3 = uVar3 & 7;
          bVar15 = true;
        }
        uVar5 = (ulong)uVar3;
        puVar14 = (ulong *)((long)puVar14 - (ulong)uVar11);
        uVar12 = *puVar14;
      }
      else {
        bVar15 = false;
        puVar14 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
      }
LAB_019410a9:
      if ((puVar8 + -3 <= dst) || (!bVar15)) goto LAB_019411a0;
      uVar13 = (uVar12 << ((byte)uVar5 & 0x3f)) >> bVar6;
      iVar10 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + (int)uVar5;
      uVar5 = (uVar12 << ((byte)iVar10 & 0x3f)) >> bVar6;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar10 = (uint)*(byte *)((long)DTable + uVar5 * 2 + 4) + iVar10;
      uVar13 = (uVar12 << ((byte)iVar10 & 0x3f)) >> bVar6;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar5 * 2 + 5);
      iVar10 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar10;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      uVar13 = (uVar12 << ((byte)iVar10 & 0x3f)) >> bVar6;
      uVar5 = (ulong)((uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar10);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      dst = (void *)((long)dst + 4);
    } while( true );
  }
  uVar3 = (uint)uVar5;
  if (uVar3 < 0x41) {
    if (puVar14 < puStack_38) {
      if (puVar14 == (ulong *)cSrc) goto LAB_019411a0;
      uVar11 = (int)puVar14 - (int)cSrc;
      if (cSrc <= (ulong *)((long)puVar14 - (uVar5 >> 3))) {
        uVar11 = (uint)(uVar5 >> 3);
      }
      uVar3 = uVar3 + uVar11 * -8;
    }
    else {
      uVar11 = (uint)(uVar5 >> 3);
      uVar3 = uVar3 & 7;
    }
    uVar5 = (ulong)uVar3;
    puVar14 = (ulong *)((long)puVar14 - (ulong)uVar11);
    uVar12 = *puVar14;
  }
  else {
    puVar14 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
  }
LAB_019411a0:
  uVar3 = (uint)uVar5;
  if (dst < puVar8) {
    do {
      uVar13 = (uVar12 << ((byte)uVar5 & 0x3f)) >> (-cVar2 & 0x3fU);
      uVar3 = (int)uVar5 + (uint)*(byte *)((long)DTable + uVar13 * 2 + 4);
      uVar5 = (ulong)uVar3;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < puVar8);
  }
  if (uVar3 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puVar14 != (ulong *)cSrc) {
    maxDstSize = 0xffffffffffffffec;
  }
  return maxDstSize;
}

Assistant:

size_t HUF_decompress1X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}